

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qps.h
# Opt level: O3

void __thiscall qps::~qps(qps *this)

{
  this->stop_ = true;
  std::thread::join();
  if ((this->thd_)._M_id._M_thread == 0) {
    return;
  }
  std::terminate();
}

Assistant:

~qps() {
    stop_ = true;
    thd_.join();
  }